

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O1

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_color
          (ansicolor_sink<spdlog::details::console_mutex> *this,level_enum color_level,
          string_view_t color)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  mapped_type *pmVar2;
  key_type local_24;
  
  __mutex = (pthread_mutex_t *)this->mutex_;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    pmVar2 = std::__detail::
             _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_fmt::v6::basic_string_view<char>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_fmt::v6::basic_string_view<char>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_fmt::v6::basic_string_view<char>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_fmt::v6::basic_string_view<char>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->colors_,&local_24);
    pmVar2->data_ = color.data_;
    pmVar2->size_ = color.size_;
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_color(level::level_enum color_level, string_view_t color)
{
    std::lock_guard<mutex_t> lock(mutex_);
    colors_[color_level] = color;
}